

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

void RuntimeManifestFile::CreateIfValid
               (string *filename,
               vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
               *manifest_files)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_578;
  string local_560;
  allocator local_539;
  string local_538;
  undefined1 local_518 [8];
  Value root_node;
  string errors;
  CharReaderBuilder builder;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_498;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430 [32];
  ostringstream local_410 [8];
  ostringstream error_ss;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator local_241;
  string local_240;
  IStream local_220 [8];
  ifstream json_stream;
  vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
  *manifest_files_local;
  string *filename_local;
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"",&local_241);
  std::operator+(&local_278,"RuntimeManifestFile::CreateIfValid - attempting to load ",filename);
  local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_298);
  LoaderLogger::LogInfoMessage(&local_240,&local_278,&local_298);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"RuntimeManifestFile::CreateIfValid ",&local_431);
  std::__cxx11::ostringstream::ostringstream(local_410,local_430,_S_out);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_410,"failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::operator<<(poVar3,".  Does it exist?");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"",&local_459);
    std::__cxx11::ostringstream::str();
    local_498.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_498.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_498.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_498);
    LoaderLogger::LogErrorMessage(&local_458,&local_480,&local_498);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_498);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
  }
  else {
    Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)((long)&errors.field_2 + 8));
    std::__cxx11::string::string((string *)&root_node.limit_);
    Json::Value::Value((Value *)local_518,nullValue);
    bVar2 = Json::parseFromStream
                      ((Factory *)((long)&errors.field_2 + 8),local_220,(Value *)local_518,
                       (String *)&root_node.limit_);
    if ((bVar2) && (bVar2 = Json::Value::isObject((Value *)local_518), bVar2)) {
      CreateIfValid((Value *)local_518,filename,manifest_files);
    }
    else {
      poVar3 = std::operator<<((ostream *)local_410,"failed to parse ");
      poVar3 = std::operator<<(poVar3,(string *)filename);
      std::operator<<(poVar3,".");
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)local_410," (Error message: ");
        poVar3 = std::operator<<(poVar3,(string *)&root_node.limit_);
        std::operator<<(poVar3,")");
      }
      std::operator<<((ostream *)local_410," Is it a valid runtime manifest file?");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_538,"",&local_539);
      std::__cxx11::ostringstream::str();
      local_578.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_578.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_578.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_578);
      LoaderLogger::LogErrorMessage(&local_538,&local_560,&local_578);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_578);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator((allocator<char> *)&local_539);
    }
    Json::Value::~Value((Value *)local_518);
    std::__cxx11::string::~string((string *)&root_node.limit_);
    Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)((long)&errors.field_2 + 8));
  }
  std::__cxx11::ostringstream::~ostringstream(local_410);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void RuntimeManifestFile::CreateIfValid(std::string const &filename,
                                        std::vector<std::unique_ptr<RuntimeManifestFile>> &manifest_files) {
    std::ifstream json_stream(filename, std::ifstream::in);

    LoaderLogger::LogInfoMessage("", "RuntimeManifestFile::CreateIfValid - attempting to load " + filename);
    std::ostringstream error_ss("RuntimeManifestFile::CreateIfValid ");
    if (!json_stream.is_open()) {
        error_ss << "failed to open " << filename << ".  Does it exist?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }
    Json::CharReaderBuilder builder;
    std::string errors;
    Json::Value root_node = Json::nullValue;
    if (!Json::parseFromStream(builder, json_stream, &root_node, &errors) || !root_node.isObject()) {
        error_ss << "failed to parse " << filename << ".";
        if (!errors.empty()) {
            error_ss << " (Error message: " << errors << ")";
        }
        error_ss << " Is it a valid runtime manifest file?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }

    CreateIfValid(root_node, filename, manifest_files);
}